

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

Node ** __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::UArrIntermediateNode::childByTop
          (UArrIntermediateNode *this,Top t,bool canCreate)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  Node **ppNVar5;
  bool bVar6;
  Top TVar7;
  byte local_58;
  int iStack_57;
  char cStack_53;
  int iStack_47;
  char cStack_43;
  
  local_58 = t._inner._inner._0_1_;
  iStack_57 = t._inner._inner._content._0_4_;
  cStack_53 = t._inner._inner._content[4];
  iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
  bVar6 = iVar1 < 1;
  if (iVar1 < 1) {
    ppNVar5 = (Node **)0x0;
  }
  else {
    ppNVar5 = this->_nodes;
    lVar4 = 0;
    do {
      TVar7 = Kernel::TermList::top(&(*ppNVar5)->_term);
      iStack_47 = TVar7._inner._inner._content._0_4_;
      cStack_43 = TVar7._inner._inner._content[4];
      if (((TVar7._inner._inner._0_1_ ^ local_58) & 1) == 0) {
        bVar2 = t._inner._inner._content._4_4_ == TVar7._inner._inner._content._4_4_;
        if (((undefined1  [12])t._inner._inner & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
          bVar2 = cStack_53 == cStack_43;
        }
        if ((iStack_57 == iStack_47) && (bVar2)) goto LAB_002f85c6;
      }
      lVar4 = lVar4 + 1;
      lVar3 = (long)*(int *)&(this->super_IntermediateNode).field_0x14;
      ppNVar5 = ppNVar5 + 1;
      bVar6 = lVar3 <= lVar4;
    } while (lVar4 < lVar3);
    ppNVar5 = (Node **)0x0;
  }
LAB_002f85c6:
  if ((bVar6 & canCreate) == 1) {
    iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
    *(int *)&(this->super_IntermediateNode).field_0x14 = iVar1 + 1;
    ppNVar5 = this->_nodes + iVar1;
    this->_nodes[(long)iVar1 + 1] = (Node *)0x0;
  }
  return ppNVar5;
}

Assistant:

typename SubstitutionTree<LeafData_>::Node** SubstitutionTree<LeafData_>::UArrIntermediateNode::
	childByTop(TermList::Top t, bool canCreate)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      return &_nodes[i];
    }
  }
  if(canCreate) {
    ASS_L(_size,UARR_INTERMEDIATE_NODE_MAX_SIZE);
    ASS_EQ(_nodes[_size],0);
    _nodes[++_size]=0;
    return &_nodes[_size-1];
  }
  return 0;
}